

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# object.cpp
# Opt level: O0

void __thiscall
ObjectTest_basic_assignment_operator_unordered_multiset_Test::TestBody
          (ObjectTest_basic_assignment_operator_unordered_multiset_Test *this)

{
  bool bVar1;
  char *pcVar2;
  AssertHelper local_1248 [8];
  Message local_1240 [8];
  unordered_set<jessilib::object,_std::hash<jessilib::object>,_std::equal_to<jessilib::object>,_std::allocator<jessilib::object>_>
  local_1238;
  unordered_set<jessilib::object,_std::hash<jessilib::object>,_std::equal_to<jessilib::object>,_std::allocator<jessilib::object>_>
  local_11f8;
  unordered_set<jessilib::object,_std::hash<jessilib::object>,_std::equal_to<jessilib::object>,_std::allocator<jessilib::object>_>
  local_11b8;
  undefined1 local_1180 [8];
  AssertionResult gtest_ar_12;
  AssertHelper local_1150 [8];
  Message local_1148 [15];
  bool local_1139;
  undefined1 local_1138 [8];
  AssertionResult gtest_ar__12;
  AssertHelper local_10e8 [8];
  Message local_10e0 [8];
  unordered_multiset<std::__cxx11::basic_string<char8_t,_std::char_traits<char8_t>,_std::allocator<char8_t>_>,_std::hash<std::__cxx11::basic_string<char8_t,_std::char_traits<char8_t>,_std::allocator<char8_t>_>_>,_std::equal_to<std::__cxx11::basic_string<char8_t,_std::char_traits<char8_t>,_std::allocator<char8_t>_>_>,_std::allocator<std::__cxx11::basic_string<char8_t,_std::char_traits<char8_t>,_std::allocator<char8_t>_>_>_>
  local_10d8;
  unordered_multiset<std::__cxx11::basic_string<char8_t,_std::char_traits<char8_t>,_std::allocator<char8_t>_>,_std::hash<std::__cxx11::basic_string<char8_t,_std::char_traits<char8_t>,_std::allocator<char8_t>_>_>,_std::equal_to<std::__cxx11::basic_string<char8_t,_std::char_traits<char8_t>,_std::allocator<char8_t>_>_>,_std::allocator<std::__cxx11::basic_string<char8_t,_std::char_traits<char8_t>,_std::allocator<char8_t>_>_>_>
  local_1098;
  unordered_multiset<std::__cxx11::basic_string<char8_t,_std::char_traits<char8_t>,_std::allocator<char8_t>_>,_std::hash<std::__cxx11::basic_string<char8_t,_std::char_traits<char8_t>,_std::allocator<char8_t>_>_>,_std::equal_to<std::__cxx11::basic_string<char8_t,_std::char_traits<char8_t>,_std::allocator<char8_t>_>_>,_std::allocator<std::__cxx11::basic_string<char8_t,_std::char_traits<char8_t>,_std::allocator<char8_t>_>_>_>
  local_1058;
  undefined1 local_1020 [8];
  AssertionResult gtest_ar_11;
  AssertHelper local_ff0 [8];
  Message local_fe8 [15];
  bool local_fd9;
  undefined1 local_fd8 [8];
  AssertionResult gtest_ar__11;
  AssertHelper local_f88 [8];
  Message local_f80 [8];
  unordered_multiset<long_double,_std::hash<long_double>,_std::equal_to<long_double>,_std::allocator<long_double>_>
  local_f78;
  unordered_multiset<long_double,_std::hash<long_double>,_std::equal_to<long_double>,_std::allocator<long_double>_>
  local_f38;
  unordered_multiset<long_double,_std::hash<long_double>,_std::equal_to<long_double>,_std::allocator<long_double>_>
  local_ef8;
  undefined1 local_ec0 [8];
  AssertionResult gtest_ar_10;
  AssertHelper local_e90 [8];
  Message local_e88 [15];
  bool local_e79;
  undefined1 local_e78 [8];
  AssertionResult gtest_ar__10;
  AssertHelper local_e28 [8];
  Message local_e20 [8];
  unordered_multiset<double,_std::hash<double>,_std::equal_to<double>,_std::allocator<double>_>
  local_e18;
  unordered_multiset<double,_std::hash<double>,_std::equal_to<double>,_std::allocator<double>_>
  local_dd8;
  unordered_multiset<double,_std::hash<double>,_std::equal_to<double>,_std::allocator<double>_>
  local_d98;
  undefined1 local_d60 [8];
  AssertionResult gtest_ar_9;
  AssertHelper local_d30 [8];
  Message local_d28 [15];
  bool local_d19;
  undefined1 local_d18 [8];
  AssertionResult gtest_ar__9;
  AssertHelper local_cc8 [8];
  Message local_cc0 [8];
  unordered_multiset<float,_std::hash<float>,_std::equal_to<float>,_std::allocator<float>_>
  local_cb8;
  unordered_multiset<float,_std::hash<float>,_std::equal_to<float>,_std::allocator<float>_>
  local_c78;
  unordered_multiset<float,_std::hash<float>,_std::equal_to<float>,_std::allocator<float>_>
  local_c38;
  undefined1 local_c00 [8];
  AssertionResult gtest_ar_8;
  AssertHelper local_bd0 [8];
  Message local_bc8 [15];
  bool local_bb9;
  undefined1 local_bb8 [8];
  AssertionResult gtest_ar__8;
  AssertHelper local_b68 [8];
  Message local_b60 [8];
  unordered_multiset<long,_std::hash<long>,_std::equal_to<long>,_std::allocator<long>_> local_b58;
  unordered_multiset<long,_std::hash<long>,_std::equal_to<long>,_std::allocator<long>_> local_b18;
  unordered_multiset<long,_std::hash<long>,_std::equal_to<long>,_std::allocator<long>_> local_ad8;
  undefined1 local_aa0 [8];
  AssertionResult gtest_ar_7;
  AssertHelper local_a70 [8];
  Message local_a68 [15];
  bool local_a59;
  undefined1 local_a58 [8];
  AssertionResult gtest_ar__7;
  AssertHelper local_a08 [8];
  Message local_a00 [8];
  unordered_multiset<long_long,_std::hash<long_long>,_std::equal_to<long_long>,_std::allocator<long_long>_>
  local_9f8;
  unordered_multiset<long_long,_std::hash<long_long>,_std::equal_to<long_long>,_std::allocator<long_long>_>
  local_9b8;
  unordered_multiset<long_long,_std::hash<long_long>,_std::equal_to<long_long>,_std::allocator<long_long>_>
  local_978;
  undefined1 local_940 [8];
  AssertionResult gtest_ar_6;
  AssertHelper local_910 [8];
  Message local_908 [15];
  bool local_8f9;
  undefined1 local_8f8 [8];
  AssertionResult gtest_ar__6;
  AssertHelper local_8a8 [8];
  Message local_8a0 [8];
  unordered_multiset<long,_std::hash<long>,_std::equal_to<long>,_std::allocator<long>_> local_898;
  unordered_multiset<long,_std::hash<long>,_std::equal_to<long>,_std::allocator<long>_> local_858;
  unordered_multiset<long,_std::hash<long>,_std::equal_to<long>,_std::allocator<long>_> local_818;
  undefined1 local_7e0 [8];
  AssertionResult gtest_ar_5;
  AssertHelper local_7b0 [8];
  Message local_7a8 [15];
  bool local_799;
  undefined1 local_798 [8];
  AssertionResult gtest_ar__5;
  AssertHelper local_748 [8];
  Message local_740 [8];
  unordered_multiset<int,_std::hash<int>,_std::equal_to<int>,_std::allocator<int>_> local_738;
  unordered_multiset<int,_std::hash<int>,_std::equal_to<int>,_std::allocator<int>_> local_6f8;
  unordered_multiset<int,_std::hash<int>,_std::equal_to<int>,_std::allocator<int>_> local_6b8;
  undefined1 local_680 [8];
  AssertionResult gtest_ar_4;
  AssertHelper local_650 [8];
  Message local_648 [15];
  bool local_639;
  undefined1 local_638 [8];
  AssertionResult gtest_ar__4;
  AssertHelper local_5e8 [8];
  Message local_5e0 [8];
  unordered_multiset<short,_std::hash<short>,_std::equal_to<short>,_std::allocator<short>_>
  local_5d8;
  unordered_multiset<short,_std::hash<short>,_std::equal_to<short>,_std::allocator<short>_>
  local_598;
  unordered_multiset<short,_std::hash<short>,_std::equal_to<short>,_std::allocator<short>_>
  local_558;
  undefined1 local_520 [8];
  AssertionResult gtest_ar_3;
  AssertHelper local_4f0 [8];
  Message local_4e8 [15];
  bool local_4d9;
  undefined1 local_4d8 [8];
  AssertionResult gtest_ar__3;
  AssertHelper local_488 [8];
  Message local_480 [8];
  unordered_multiset<unsigned_char,_std::hash<unsigned_char>,_std::equal_to<unsigned_char>,_std::allocator<unsigned_char>_>
  local_478;
  unordered_multiset<unsigned_char,_std::hash<unsigned_char>,_std::equal_to<unsigned_char>,_std::allocator<unsigned_char>_>
  local_438;
  unordered_multiset<unsigned_char,_std::hash<unsigned_char>,_std::equal_to<unsigned_char>,_std::allocator<unsigned_char>_>
  local_3f8;
  undefined1 local_3c0 [8];
  AssertionResult gtest_ar_2;
  AssertHelper local_390 [8];
  Message local_388 [15];
  bool local_379;
  undefined1 local_378 [8];
  AssertionResult gtest_ar__2;
  AssertHelper local_328 [8];
  Message local_320 [8];
  unordered_multiset<signed_char,_std::hash<signed_char>,_std::equal_to<signed_char>,_std::allocator<signed_char>_>
  local_318;
  unordered_multiset<signed_char,_std::hash<signed_char>,_std::equal_to<signed_char>,_std::allocator<signed_char>_>
  local_2d8;
  unordered_multiset<signed_char,_std::hash<signed_char>,_std::equal_to<signed_char>,_std::allocator<signed_char>_>
  local_298;
  undefined1 local_260 [8];
  AssertionResult gtest_ar_1;
  AssertHelper local_230 [8];
  Message local_228 [15];
  bool local_219;
  undefined1 local_218 [8];
  AssertionResult gtest_ar__1;
  AssertHelper local_1c8 [8];
  Message local_1c0 [8];
  unordered_multiset<bool,_std::hash<bool>,_std::equal_to<bool>,_std::allocator<bool>_> local_1b8;
  unordered_multiset<bool,_std::hash<bool>,_std::equal_to<bool>,_std::allocator<bool>_> local_178;
  unordered_multiset<bool,_std::hash<bool>,_std::equal_to<bool>,_std::allocator<bool>_> local_138;
  undefined1 local_100 [8];
  AssertionResult gtest_ar;
  AssertHelper local_d0 [8];
  Message local_c8 [15];
  bool local_b9;
  undefined1 local_b8 [8];
  AssertionResult gtest_ar_;
  unordered_multiset<bool,_std::hash<bool>,_std::equal_to<bool>,_std::allocator<bool>_> local_98;
  undefined1 local_58 [8];
  object obj;
  ObjectTest_basic_assignment_operator_unordered_multiset_Test *this_local;
  
  jessilib::object::object((object *)local_58);
  local_98._M_h._M_rehash_policy._M_max_load_factor = 0.0;
  local_98._M_h._M_rehash_policy._4_4_ = 0;
  local_98._M_h._M_rehash_policy._M_next_resize = 0;
  local_98._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
  local_98._M_h._M_element_count = 0;
  local_98._M_h._M_buckets = (__buckets_ptr)0x0;
  local_98._M_h._M_bucket_count = 0;
  local_98._M_h._M_single_bucket = (__node_base_ptr)0x0;
  std::unordered_multiset<bool,_std::hash<bool>,_std::equal_to<bool>,_std::allocator<bool>_>::
  unordered_multiset(&local_98);
  jessilib::object::
  operator=<std::unordered_multiset<bool,_std::hash<bool>,_std::equal_to<bool>,_std::allocator<bool>_>,_nullptr>
            ((object *)local_58,&local_98);
  std::unordered_multiset<bool,_std::hash<bool>,_std::equal_to<bool>,_std::allocator<bool>_>::
  ~unordered_multiset(&local_98);
  local_b9 = jessilib::object::
             has<std::unordered_multiset<bool,std::hash<bool>,std::equal_to<bool>,std::allocator<bool>>>
                       ((object *)local_58);
  testing::AssertionResult::AssertionResult<bool>((AssertionResult *)local_b8,&local_b9,(type *)0x0)
  ;
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_b8);
  if (!bVar1) {
    testing::Message::Message(local_c8);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((AssertionResult *)&gtest_ar.message_,local_b8,
               "obj .has< std::unordered_multiset<bool> >()","false");
    pcVar2 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::c_str
                       ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                        &gtest_ar.message_);
    testing::internal::AssertHelper::AssertHelper
              (local_d0,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/JAJames[P]Jupiter-Bot/src/Jupiter/src/jessilib/src/test/object.cpp"
               ,0x317,pcVar2);
    testing::internal::AssertHelper::operator=(local_d0,local_c8);
    testing::internal::AssertHelper::~AssertHelper(local_d0);
    std::__cxx11::string::~string((string *)&gtest_ar.message_);
    testing::Message::~Message(local_c8);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_b8);
  local_178._M_h._M_rehash_policy._M_max_load_factor = 0.0;
  local_178._M_h._M_rehash_policy._4_4_ = 0;
  local_178._M_h._M_rehash_policy._M_next_resize = 0;
  local_178._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
  local_178._M_h._M_element_count = 0;
  local_178._M_h._M_buckets = (__buckets_ptr)0x0;
  local_178._M_h._M_bucket_count = 0;
  local_178._M_h._M_single_bucket = (__node_base_ptr)0x0;
  std::unordered_multiset<bool,_std::hash<bool>,_std::equal_to<bool>,_std::allocator<bool>_>::
  unordered_multiset(&local_178);
  jessilib::object::
  get<std::unordered_multiset<bool,_std::hash<bool>,_std::equal_to<bool>,_std::allocator<bool>_>,_std::unordered_multiset<bool,_std::hash<bool>,_std::equal_to<bool>,_std::allocator<bool>_>,_nullptr>
            (&local_138,(object *)local_58,&local_178);
  local_1b8._M_h._M_rehash_policy._M_max_load_factor = 0.0;
  local_1b8._M_h._M_rehash_policy._4_4_ = 0;
  local_1b8._M_h._M_rehash_policy._M_next_resize = 0;
  local_1b8._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
  local_1b8._M_h._M_element_count = 0;
  local_1b8._M_h._M_buckets = (__buckets_ptr)0x0;
  local_1b8._M_h._M_bucket_count = 0;
  local_1b8._M_h._M_single_bucket = (__node_base_ptr)0x0;
  std::unordered_multiset<bool,_std::hash<bool>,_std::equal_to<bool>,_std::allocator<bool>_>::
  unordered_multiset(&local_1b8);
  testing::internal::EqHelper::
  Compare<std::unordered_multiset<bool,_std::hash<bool>,_std::equal_to<bool>,_std::allocator<bool>_>,_std::unordered_multiset<bool,_std::hash<bool>,_std::equal_to<bool>,_std::allocator<bool>_>,_nullptr>
            ((EqHelper *)local_100,"obj .get< std::unordered_multiset<bool> >()",
             "std::unordered_multiset<bool> {}",&local_138,&local_1b8);
  std::unordered_multiset<bool,_std::hash<bool>,_std::equal_to<bool>,_std::allocator<bool>_>::
  ~unordered_multiset(&local_1b8);
  std::unordered_multiset<bool,_std::hash<bool>,_std::equal_to<bool>,_std::allocator<bool>_>::
  ~unordered_multiset(&local_138);
  std::unordered_multiset<bool,_std::hash<bool>,_std::equal_to<bool>,_std::allocator<bool>_>::
  ~unordered_multiset(&local_178);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_100);
  if (!bVar1) {
    testing::Message::Message(local_1c0);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_100);
    testing::internal::AssertHelper::AssertHelper
              (local_1c8,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/JAJames[P]Jupiter-Bot/src/Jupiter/src/jessilib/src/test/object.cpp"
               ,0x317,pcVar2);
    testing::internal::AssertHelper::operator=(local_1c8,local_1c0);
    testing::internal::AssertHelper::~AssertHelper(local_1c8);
    testing::Message::~Message(local_1c0);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_100);
  gtest_ar__1.message_._M_t.
  super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_t.
  super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  .
  super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  ._M_head_impl =
       (__uniq_ptr_data<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
        )(__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          )0x0;
  std::
  unordered_multiset<signed_char,_std::hash<signed_char>,_std::equal_to<signed_char>,_std::allocator<signed_char>_>
  ::unordered_multiset
            ((unordered_multiset<signed_char,_std::hash<signed_char>,_std::equal_to<signed_char>,_std::allocator<signed_char>_>
              *)&gtest_ar__1.message_);
  jessilib::object::
  operator=<std::unordered_multiset<signed_char,_std::hash<signed_char>,_std::equal_to<signed_char>,_std::allocator<signed_char>_>,_nullptr>
            ((object *)local_58,
             (unordered_multiset<signed_char,_std::hash<signed_char>,_std::equal_to<signed_char>,_std::allocator<signed_char>_>
              *)&gtest_ar__1.message_);
  std::
  unordered_multiset<signed_char,_std::hash<signed_char>,_std::equal_to<signed_char>,_std::allocator<signed_char>_>
  ::~unordered_multiset
            ((unordered_multiset<signed_char,_std::hash<signed_char>,_std::equal_to<signed_char>,_std::allocator<signed_char>_>
              *)&gtest_ar__1.message_);
  local_219 = jessilib::object::
              has<std::unordered_multiset<signed_char,std::hash<signed_char>,std::equal_to<signed_char>,std::allocator<signed_char>>>
                        ((object *)local_58);
  testing::AssertionResult::AssertionResult<bool>
            ((AssertionResult *)local_218,&local_219,(type *)0x0);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_218);
  if (!bVar1) {
    testing::Message::Message(local_228);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((AssertionResult *)&gtest_ar_1.message_,local_218,
               "obj .has< std::unordered_multiset<signed char> >()","false");
    pcVar2 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::c_str
                       ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                        &gtest_ar_1.message_);
    testing::internal::AssertHelper::AssertHelper
              (local_230,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/JAJames[P]Jupiter-Bot/src/Jupiter/src/jessilib/src/test/object.cpp"
               ,0x318,pcVar2);
    testing::internal::AssertHelper::operator=(local_230,local_228);
    testing::internal::AssertHelper::~AssertHelper(local_230);
    std::__cxx11::string::~string((string *)&gtest_ar_1.message_);
    testing::Message::~Message(local_228);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_218);
  local_2d8._M_h._M_rehash_policy._M_max_load_factor = 0.0;
  local_2d8._M_h._M_rehash_policy._4_4_ = 0;
  local_2d8._M_h._M_rehash_policy._M_next_resize = 0;
  local_2d8._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
  local_2d8._M_h._M_element_count = 0;
  local_2d8._M_h._M_buckets = (__buckets_ptr)0x0;
  local_2d8._M_h._M_bucket_count = 0;
  local_2d8._M_h._M_single_bucket = (__node_base_ptr)0x0;
  std::
  unordered_multiset<signed_char,_std::hash<signed_char>,_std::equal_to<signed_char>,_std::allocator<signed_char>_>
  ::unordered_multiset(&local_2d8);
  jessilib::object::
  get<std::unordered_multiset<signed_char,_std::hash<signed_char>,_std::equal_to<signed_char>,_std::allocator<signed_char>_>,_std::unordered_multiset<signed_char,_std::hash<signed_char>,_std::equal_to<signed_char>,_std::allocator<signed_char>_>,_nullptr>
            (&local_298,(object *)local_58,&local_2d8);
  local_318._M_h._M_rehash_policy._M_max_load_factor = 0.0;
  local_318._M_h._M_rehash_policy._4_4_ = 0;
  local_318._M_h._M_rehash_policy._M_next_resize = 0;
  local_318._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
  local_318._M_h._M_element_count = 0;
  local_318._M_h._M_buckets = (__buckets_ptr)0x0;
  local_318._M_h._M_bucket_count = 0;
  local_318._M_h._M_single_bucket = (__node_base_ptr)0x0;
  std::
  unordered_multiset<signed_char,_std::hash<signed_char>,_std::equal_to<signed_char>,_std::allocator<signed_char>_>
  ::unordered_multiset(&local_318);
  testing::internal::EqHelper::
  Compare<std::unordered_multiset<signed_char,_std::hash<signed_char>,_std::equal_to<signed_char>,_std::allocator<signed_char>_>,_std::unordered_multiset<signed_char,_std::hash<signed_char>,_std::equal_to<signed_char>,_std::allocator<signed_char>_>,_nullptr>
            ((EqHelper *)local_260,"obj .get< std::unordered_multiset<signed char> >()",
             "std::unordered_multiset<signed char> {}",&local_298,&local_318);
  std::
  unordered_multiset<signed_char,_std::hash<signed_char>,_std::equal_to<signed_char>,_std::allocator<signed_char>_>
  ::~unordered_multiset(&local_318);
  std::
  unordered_multiset<signed_char,_std::hash<signed_char>,_std::equal_to<signed_char>,_std::allocator<signed_char>_>
  ::~unordered_multiset(&local_298);
  std::
  unordered_multiset<signed_char,_std::hash<signed_char>,_std::equal_to<signed_char>,_std::allocator<signed_char>_>
  ::~unordered_multiset(&local_2d8);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_260);
  if (!bVar1) {
    testing::Message::Message(local_320);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_260);
    testing::internal::AssertHelper::AssertHelper
              (local_328,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/JAJames[P]Jupiter-Bot/src/Jupiter/src/jessilib/src/test/object.cpp"
               ,0x318,pcVar2);
    testing::internal::AssertHelper::operator=(local_328,local_320);
    testing::internal::AssertHelper::~AssertHelper(local_328);
    testing::Message::~Message(local_320);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_260);
  gtest_ar__2.message_._M_t.
  super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_t.
  super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  .
  super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  ._M_head_impl =
       (__uniq_ptr_data<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
        )(__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          )0x0;
  std::
  unordered_multiset<unsigned_char,_std::hash<unsigned_char>,_std::equal_to<unsigned_char>,_std::allocator<unsigned_char>_>
  ::unordered_multiset
            ((unordered_multiset<unsigned_char,_std::hash<unsigned_char>,_std::equal_to<unsigned_char>,_std::allocator<unsigned_char>_>
              *)&gtest_ar__2.message_);
  jessilib::object::
  operator=<std::unordered_multiset<unsigned_char,_std::hash<unsigned_char>,_std::equal_to<unsigned_char>,_std::allocator<unsigned_char>_>,_nullptr>
            ((object *)local_58,
             (unordered_multiset<unsigned_char,_std::hash<unsigned_char>,_std::equal_to<unsigned_char>,_std::allocator<unsigned_char>_>
              *)&gtest_ar__2.message_);
  std::
  unordered_multiset<unsigned_char,_std::hash<unsigned_char>,_std::equal_to<unsigned_char>,_std::allocator<unsigned_char>_>
  ::~unordered_multiset
            ((unordered_multiset<unsigned_char,_std::hash<unsigned_char>,_std::equal_to<unsigned_char>,_std::allocator<unsigned_char>_>
              *)&gtest_ar__2.message_);
  local_379 = jessilib::object::
              has<std::unordered_multiset<unsigned_char,std::hash<unsigned_char>,std::equal_to<unsigned_char>,std::allocator<unsigned_char>>>
                        ((object *)local_58);
  testing::AssertionResult::AssertionResult<bool>
            ((AssertionResult *)local_378,&local_379,(type *)0x0);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_378);
  if (!bVar1) {
    testing::Message::Message(local_388);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((AssertionResult *)&gtest_ar_2.message_,local_378,
               "obj .has< std::unordered_multiset<unsigned char> >()","false");
    pcVar2 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::c_str
                       ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                        &gtest_ar_2.message_);
    testing::internal::AssertHelper::AssertHelper
              (local_390,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/JAJames[P]Jupiter-Bot/src/Jupiter/src/jessilib/src/test/object.cpp"
               ,0x319,pcVar2);
    testing::internal::AssertHelper::operator=(local_390,local_388);
    testing::internal::AssertHelper::~AssertHelper(local_390);
    std::__cxx11::string::~string((string *)&gtest_ar_2.message_);
    testing::Message::~Message(local_388);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_378);
  local_438._M_h._M_rehash_policy._M_max_load_factor = 0.0;
  local_438._M_h._M_rehash_policy._4_4_ = 0;
  local_438._M_h._M_rehash_policy._M_next_resize = 0;
  local_438._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
  local_438._M_h._M_element_count = 0;
  local_438._M_h._M_buckets = (__buckets_ptr)0x0;
  local_438._M_h._M_bucket_count = 0;
  local_438._M_h._M_single_bucket = (__node_base_ptr)0x0;
  std::
  unordered_multiset<unsigned_char,_std::hash<unsigned_char>,_std::equal_to<unsigned_char>,_std::allocator<unsigned_char>_>
  ::unordered_multiset(&local_438);
  jessilib::object::
  get<std::unordered_multiset<unsigned_char,_std::hash<unsigned_char>,_std::equal_to<unsigned_char>,_std::allocator<unsigned_char>_>,_std::unordered_multiset<unsigned_char,_std::hash<unsigned_char>,_std::equal_to<unsigned_char>,_std::allocator<unsigned_char>_>,_nullptr>
            (&local_3f8,(object *)local_58,&local_438);
  local_478._M_h._M_rehash_policy._M_max_load_factor = 0.0;
  local_478._M_h._M_rehash_policy._4_4_ = 0;
  local_478._M_h._M_rehash_policy._M_next_resize = 0;
  local_478._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
  local_478._M_h._M_element_count = 0;
  local_478._M_h._M_buckets = (__buckets_ptr)0x0;
  local_478._M_h._M_bucket_count = 0;
  local_478._M_h._M_single_bucket = (__node_base_ptr)0x0;
  std::
  unordered_multiset<unsigned_char,_std::hash<unsigned_char>,_std::equal_to<unsigned_char>,_std::allocator<unsigned_char>_>
  ::unordered_multiset(&local_478);
  testing::internal::EqHelper::
  Compare<std::unordered_multiset<unsigned_char,_std::hash<unsigned_char>,_std::equal_to<unsigned_char>,_std::allocator<unsigned_char>_>,_std::unordered_multiset<unsigned_char,_std::hash<unsigned_char>,_std::equal_to<unsigned_char>,_std::allocator<unsigned_char>_>,_nullptr>
            ((EqHelper *)local_3c0,"obj .get< std::unordered_multiset<unsigned char> >()",
             "std::unordered_multiset<unsigned char> {}",&local_3f8,&local_478);
  std::
  unordered_multiset<unsigned_char,_std::hash<unsigned_char>,_std::equal_to<unsigned_char>,_std::allocator<unsigned_char>_>
  ::~unordered_multiset(&local_478);
  std::
  unordered_multiset<unsigned_char,_std::hash<unsigned_char>,_std::equal_to<unsigned_char>,_std::allocator<unsigned_char>_>
  ::~unordered_multiset(&local_3f8);
  std::
  unordered_multiset<unsigned_char,_std::hash<unsigned_char>,_std::equal_to<unsigned_char>,_std::allocator<unsigned_char>_>
  ::~unordered_multiset(&local_438);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_3c0);
  if (!bVar1) {
    testing::Message::Message(local_480);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_3c0);
    testing::internal::AssertHelper::AssertHelper
              (local_488,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/JAJames[P]Jupiter-Bot/src/Jupiter/src/jessilib/src/test/object.cpp"
               ,0x319,pcVar2);
    testing::internal::AssertHelper::operator=(local_488,local_480);
    testing::internal::AssertHelper::~AssertHelper(local_488);
    testing::Message::~Message(local_480);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_3c0);
  gtest_ar__3.message_._M_t.
  super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_t.
  super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  .
  super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  ._M_head_impl =
       (__uniq_ptr_data<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
        )(__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          )0x0;
  std::unordered_multiset<short,_std::hash<short>,_std::equal_to<short>,_std::allocator<short>_>::
  unordered_multiset((unordered_multiset<short,_std::hash<short>,_std::equal_to<short>,_std::allocator<short>_>
                      *)&gtest_ar__3.message_);
  jessilib::object::
  operator=<std::unordered_multiset<short,_std::hash<short>,_std::equal_to<short>,_std::allocator<short>_>,_nullptr>
            ((object *)local_58,
             (unordered_multiset<short,_std::hash<short>,_std::equal_to<short>,_std::allocator<short>_>
              *)&gtest_ar__3.message_);
  std::unordered_multiset<short,_std::hash<short>,_std::equal_to<short>,_std::allocator<short>_>::
  ~unordered_multiset((unordered_multiset<short,_std::hash<short>,_std::equal_to<short>,_std::allocator<short>_>
                       *)&gtest_ar__3.message_);
  local_4d9 = jessilib::object::
              has<std::unordered_multiset<short,std::hash<short>,std::equal_to<short>,std::allocator<short>>>
                        ((object *)local_58);
  testing::AssertionResult::AssertionResult<bool>
            ((AssertionResult *)local_4d8,&local_4d9,(type *)0x0);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_4d8);
  if (!bVar1) {
    testing::Message::Message(local_4e8);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((AssertionResult *)&gtest_ar_3.message_,local_4d8,
               "obj .has< std::unordered_multiset<short> >()","false");
    pcVar2 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::c_str
                       ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                        &gtest_ar_3.message_);
    testing::internal::AssertHelper::AssertHelper
              (local_4f0,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/JAJames[P]Jupiter-Bot/src/Jupiter/src/jessilib/src/test/object.cpp"
               ,0x31a,pcVar2);
    testing::internal::AssertHelper::operator=(local_4f0,local_4e8);
    testing::internal::AssertHelper::~AssertHelper(local_4f0);
    std::__cxx11::string::~string((string *)&gtest_ar_3.message_);
    testing::Message::~Message(local_4e8);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_4d8);
  local_598._M_h._M_rehash_policy._M_max_load_factor = 0.0;
  local_598._M_h._M_rehash_policy._4_4_ = 0;
  local_598._M_h._M_rehash_policy._M_next_resize = 0;
  local_598._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
  local_598._M_h._M_element_count = 0;
  local_598._M_h._M_buckets = (__buckets_ptr)0x0;
  local_598._M_h._M_bucket_count = 0;
  local_598._M_h._M_single_bucket = (__node_base_ptr)0x0;
  std::unordered_multiset<short,_std::hash<short>,_std::equal_to<short>,_std::allocator<short>_>::
  unordered_multiset(&local_598);
  jessilib::object::
  get<std::unordered_multiset<short,_std::hash<short>,_std::equal_to<short>,_std::allocator<short>_>,_std::unordered_multiset<short,_std::hash<short>,_std::equal_to<short>,_std::allocator<short>_>,_nullptr>
            (&local_558,(object *)local_58,&local_598);
  local_5d8._M_h._M_rehash_policy._M_max_load_factor = 0.0;
  local_5d8._M_h._M_rehash_policy._4_4_ = 0;
  local_5d8._M_h._M_rehash_policy._M_next_resize = 0;
  local_5d8._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
  local_5d8._M_h._M_element_count = 0;
  local_5d8._M_h._M_buckets = (__buckets_ptr)0x0;
  local_5d8._M_h._M_bucket_count = 0;
  local_5d8._M_h._M_single_bucket = (__node_base_ptr)0x0;
  std::unordered_multiset<short,_std::hash<short>,_std::equal_to<short>,_std::allocator<short>_>::
  unordered_multiset(&local_5d8);
  testing::internal::EqHelper::
  Compare<std::unordered_multiset<short,_std::hash<short>,_std::equal_to<short>,_std::allocator<short>_>,_std::unordered_multiset<short,_std::hash<short>,_std::equal_to<short>,_std::allocator<short>_>,_nullptr>
            ((EqHelper *)local_520,"obj .get< std::unordered_multiset<short> >()",
             "std::unordered_multiset<short> {}",&local_558,&local_5d8);
  std::unordered_multiset<short,_std::hash<short>,_std::equal_to<short>,_std::allocator<short>_>::
  ~unordered_multiset(&local_5d8);
  std::unordered_multiset<short,_std::hash<short>,_std::equal_to<short>,_std::allocator<short>_>::
  ~unordered_multiset(&local_558);
  std::unordered_multiset<short,_std::hash<short>,_std::equal_to<short>,_std::allocator<short>_>::
  ~unordered_multiset(&local_598);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_520);
  if (!bVar1) {
    testing::Message::Message(local_5e0);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_520);
    testing::internal::AssertHelper::AssertHelper
              (local_5e8,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/JAJames[P]Jupiter-Bot/src/Jupiter/src/jessilib/src/test/object.cpp"
               ,0x31a,pcVar2);
    testing::internal::AssertHelper::operator=(local_5e8,local_5e0);
    testing::internal::AssertHelper::~AssertHelper(local_5e8);
    testing::Message::~Message(local_5e0);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_520);
  gtest_ar__4.message_._M_t.
  super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_t.
  super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  .
  super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  ._M_head_impl =
       (__uniq_ptr_data<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
        )(__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          )0x0;
  std::unordered_multiset<int,_std::hash<int>,_std::equal_to<int>,_std::allocator<int>_>::
  unordered_multiset((unordered_multiset<int,_std::hash<int>,_std::equal_to<int>,_std::allocator<int>_>
                      *)&gtest_ar__4.message_);
  jessilib::object::
  operator=<std::unordered_multiset<int,_std::hash<int>,_std::equal_to<int>,_std::allocator<int>_>,_nullptr>
            ((object *)local_58,
             (unordered_multiset<int,_std::hash<int>,_std::equal_to<int>,_std::allocator<int>_> *)
             &gtest_ar__4.message_);
  std::unordered_multiset<int,_std::hash<int>,_std::equal_to<int>,_std::allocator<int>_>::
  ~unordered_multiset((unordered_multiset<int,_std::hash<int>,_std::equal_to<int>,_std::allocator<int>_>
                       *)&gtest_ar__4.message_);
  local_639 = jessilib::object::
              has<std::unordered_multiset<int,std::hash<int>,std::equal_to<int>,std::allocator<int>>>
                        ((object *)local_58);
  testing::AssertionResult::AssertionResult<bool>
            ((AssertionResult *)local_638,&local_639,(type *)0x0);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_638);
  if (!bVar1) {
    testing::Message::Message(local_648);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((AssertionResult *)&gtest_ar_4.message_,local_638,
               "obj .has< std::unordered_multiset<int> >()","false");
    pcVar2 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::c_str
                       ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                        &gtest_ar_4.message_);
    testing::internal::AssertHelper::AssertHelper
              (local_650,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/JAJames[P]Jupiter-Bot/src/Jupiter/src/jessilib/src/test/object.cpp"
               ,0x31b,pcVar2);
    testing::internal::AssertHelper::operator=(local_650,local_648);
    testing::internal::AssertHelper::~AssertHelper(local_650);
    std::__cxx11::string::~string((string *)&gtest_ar_4.message_);
    testing::Message::~Message(local_648);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_638);
  local_6f8._M_h._M_rehash_policy._M_max_load_factor = 0.0;
  local_6f8._M_h._M_rehash_policy._4_4_ = 0;
  local_6f8._M_h._M_rehash_policy._M_next_resize = 0;
  local_6f8._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
  local_6f8._M_h._M_element_count = 0;
  local_6f8._M_h._M_buckets = (__buckets_ptr)0x0;
  local_6f8._M_h._M_bucket_count = 0;
  local_6f8._M_h._M_single_bucket = (__node_base_ptr)0x0;
  std::unordered_multiset<int,_std::hash<int>,_std::equal_to<int>,_std::allocator<int>_>::
  unordered_multiset(&local_6f8);
  jessilib::object::
  get<std::unordered_multiset<int,_std::hash<int>,_std::equal_to<int>,_std::allocator<int>_>,_std::unordered_multiset<int,_std::hash<int>,_std::equal_to<int>,_std::allocator<int>_>,_nullptr>
            (&local_6b8,(object *)local_58,&local_6f8);
  local_738._M_h._M_rehash_policy._M_max_load_factor = 0.0;
  local_738._M_h._M_rehash_policy._4_4_ = 0;
  local_738._M_h._M_rehash_policy._M_next_resize = 0;
  local_738._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
  local_738._M_h._M_element_count = 0;
  local_738._M_h._M_buckets = (__buckets_ptr)0x0;
  local_738._M_h._M_bucket_count = 0;
  local_738._M_h._M_single_bucket = (__node_base_ptr)0x0;
  std::unordered_multiset<int,_std::hash<int>,_std::equal_to<int>,_std::allocator<int>_>::
  unordered_multiset(&local_738);
  testing::internal::EqHelper::
  Compare<std::unordered_multiset<int,_std::hash<int>,_std::equal_to<int>,_std::allocator<int>_>,_std::unordered_multiset<int,_std::hash<int>,_std::equal_to<int>,_std::allocator<int>_>,_nullptr>
            ((EqHelper *)local_680,"obj .get< std::unordered_multiset<int> >()",
             "std::unordered_multiset<int> {}",&local_6b8,&local_738);
  std::unordered_multiset<int,_std::hash<int>,_std::equal_to<int>,_std::allocator<int>_>::
  ~unordered_multiset(&local_738);
  std::unordered_multiset<int,_std::hash<int>,_std::equal_to<int>,_std::allocator<int>_>::
  ~unordered_multiset(&local_6b8);
  std::unordered_multiset<int,_std::hash<int>,_std::equal_to<int>,_std::allocator<int>_>::
  ~unordered_multiset(&local_6f8);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_680);
  if (!bVar1) {
    testing::Message::Message(local_740);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_680);
    testing::internal::AssertHelper::AssertHelper
              (local_748,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/JAJames[P]Jupiter-Bot/src/Jupiter/src/jessilib/src/test/object.cpp"
               ,0x31b,pcVar2);
    testing::internal::AssertHelper::operator=(local_748,local_740);
    testing::internal::AssertHelper::~AssertHelper(local_748);
    testing::Message::~Message(local_740);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_680);
  gtest_ar__5.message_._M_t.
  super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_t.
  super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  .
  super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  ._M_head_impl =
       (__uniq_ptr_data<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
        )(__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          )0x0;
  std::unordered_multiset<long,_std::hash<long>,_std::equal_to<long>,_std::allocator<long>_>::
  unordered_multiset((unordered_multiset<long,_std::hash<long>,_std::equal_to<long>,_std::allocator<long>_>
                      *)&gtest_ar__5.message_);
  jessilib::object::
  operator=<std::unordered_multiset<long,_std::hash<long>,_std::equal_to<long>,_std::allocator<long>_>,_nullptr>
            ((object *)local_58,
             (unordered_multiset<long,_std::hash<long>,_std::equal_to<long>,_std::allocator<long>_>
              *)&gtest_ar__5.message_);
  std::unordered_multiset<long,_std::hash<long>,_std::equal_to<long>,_std::allocator<long>_>::
  ~unordered_multiset((unordered_multiset<long,_std::hash<long>,_std::equal_to<long>,_std::allocator<long>_>
                       *)&gtest_ar__5.message_);
  local_799 = jessilib::object::
              has<std::unordered_multiset<long,std::hash<long>,std::equal_to<long>,std::allocator<long>>>
                        ((object *)local_58);
  testing::AssertionResult::AssertionResult<bool>
            ((AssertionResult *)local_798,&local_799,(type *)0x0);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_798);
  if (!bVar1) {
    testing::Message::Message(local_7a8);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((AssertionResult *)&gtest_ar_5.message_,local_798,
               "obj .has< std::unordered_multiset<long> >()","false");
    pcVar2 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::c_str
                       ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                        &gtest_ar_5.message_);
    testing::internal::AssertHelper::AssertHelper
              (local_7b0,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/JAJames[P]Jupiter-Bot/src/Jupiter/src/jessilib/src/test/object.cpp"
               ,0x31c,pcVar2);
    testing::internal::AssertHelper::operator=(local_7b0,local_7a8);
    testing::internal::AssertHelper::~AssertHelper(local_7b0);
    std::__cxx11::string::~string((string *)&gtest_ar_5.message_);
    testing::Message::~Message(local_7a8);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_798);
  local_858._M_h._M_rehash_policy._M_max_load_factor = 0.0;
  local_858._M_h._M_rehash_policy._4_4_ = 0;
  local_858._M_h._M_rehash_policy._M_next_resize = 0;
  local_858._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
  local_858._M_h._M_element_count = 0;
  local_858._M_h._M_buckets = (__buckets_ptr)0x0;
  local_858._M_h._M_bucket_count = 0;
  local_858._M_h._M_single_bucket = (__node_base_ptr)0x0;
  std::unordered_multiset<long,_std::hash<long>,_std::equal_to<long>,_std::allocator<long>_>::
  unordered_multiset(&local_858);
  jessilib::object::
  get<std::unordered_multiset<long,_std::hash<long>,_std::equal_to<long>,_std::allocator<long>_>,_std::unordered_multiset<long,_std::hash<long>,_std::equal_to<long>,_std::allocator<long>_>,_nullptr>
            (&local_818,(object *)local_58,&local_858);
  local_898._M_h._M_rehash_policy._M_max_load_factor = 0.0;
  local_898._M_h._M_rehash_policy._4_4_ = 0;
  local_898._M_h._M_rehash_policy._M_next_resize = 0;
  local_898._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
  local_898._M_h._M_element_count = 0;
  local_898._M_h._M_buckets = (__buckets_ptr)0x0;
  local_898._M_h._M_bucket_count = 0;
  local_898._M_h._M_single_bucket = (__node_base_ptr)0x0;
  std::unordered_multiset<long,_std::hash<long>,_std::equal_to<long>,_std::allocator<long>_>::
  unordered_multiset(&local_898);
  testing::internal::EqHelper::
  Compare<std::unordered_multiset<long,_std::hash<long>,_std::equal_to<long>,_std::allocator<long>_>,_std::unordered_multiset<long,_std::hash<long>,_std::equal_to<long>,_std::allocator<long>_>,_nullptr>
            ((EqHelper *)local_7e0,"obj .get< std::unordered_multiset<long> >()",
             "std::unordered_multiset<long> {}",&local_818,&local_898);
  std::unordered_multiset<long,_std::hash<long>,_std::equal_to<long>,_std::allocator<long>_>::
  ~unordered_multiset(&local_898);
  std::unordered_multiset<long,_std::hash<long>,_std::equal_to<long>,_std::allocator<long>_>::
  ~unordered_multiset(&local_818);
  std::unordered_multiset<long,_std::hash<long>,_std::equal_to<long>,_std::allocator<long>_>::
  ~unordered_multiset(&local_858);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_7e0);
  if (!bVar1) {
    testing::Message::Message(local_8a0);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_7e0);
    testing::internal::AssertHelper::AssertHelper
              (local_8a8,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/JAJames[P]Jupiter-Bot/src/Jupiter/src/jessilib/src/test/object.cpp"
               ,0x31c,pcVar2);
    testing::internal::AssertHelper::operator=(local_8a8,local_8a0);
    testing::internal::AssertHelper::~AssertHelper(local_8a8);
    testing::Message::~Message(local_8a0);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_7e0);
  gtest_ar__6.message_._M_t.
  super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_t.
  super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  .
  super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  ._M_head_impl =
       (__uniq_ptr_data<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
        )(__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          )0x0;
  std::
  unordered_multiset<long_long,_std::hash<long_long>,_std::equal_to<long_long>,_std::allocator<long_long>_>
  ::unordered_multiset
            ((unordered_multiset<long_long,_std::hash<long_long>,_std::equal_to<long_long>,_std::allocator<long_long>_>
              *)&gtest_ar__6.message_);
  jessilib::object::
  operator=<std::unordered_multiset<long_long,_std::hash<long_long>,_std::equal_to<long_long>,_std::allocator<long_long>_>,_nullptr>
            ((object *)local_58,
             (unordered_multiset<long_long,_std::hash<long_long>,_std::equal_to<long_long>,_std::allocator<long_long>_>
              *)&gtest_ar__6.message_);
  std::
  unordered_multiset<long_long,_std::hash<long_long>,_std::equal_to<long_long>,_std::allocator<long_long>_>
  ::~unordered_multiset
            ((unordered_multiset<long_long,_std::hash<long_long>,_std::equal_to<long_long>,_std::allocator<long_long>_>
              *)&gtest_ar__6.message_);
  local_8f9 = jessilib::object::
              has<std::unordered_multiset<long_long,std::hash<long_long>,std::equal_to<long_long>,std::allocator<long_long>>>
                        ((object *)local_58);
  testing::AssertionResult::AssertionResult<bool>
            ((AssertionResult *)local_8f8,&local_8f9,(type *)0x0);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_8f8);
  if (!bVar1) {
    testing::Message::Message(local_908);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((AssertionResult *)&gtest_ar_6.message_,local_8f8,
               "obj .has< std::unordered_multiset<long long> >()","false");
    pcVar2 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::c_str
                       ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                        &gtest_ar_6.message_);
    testing::internal::AssertHelper::AssertHelper
              (local_910,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/JAJames[P]Jupiter-Bot/src/Jupiter/src/jessilib/src/test/object.cpp"
               ,0x31d,pcVar2);
    testing::internal::AssertHelper::operator=(local_910,local_908);
    testing::internal::AssertHelper::~AssertHelper(local_910);
    std::__cxx11::string::~string((string *)&gtest_ar_6.message_);
    testing::Message::~Message(local_908);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_8f8);
  local_9b8._M_h._M_rehash_policy._M_max_load_factor = 0.0;
  local_9b8._M_h._M_rehash_policy._4_4_ = 0;
  local_9b8._M_h._M_rehash_policy._M_next_resize = 0;
  local_9b8._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
  local_9b8._M_h._M_element_count = 0;
  local_9b8._M_h._M_buckets = (__buckets_ptr)0x0;
  local_9b8._M_h._M_bucket_count = 0;
  local_9b8._M_h._M_single_bucket = (__node_base_ptr)0x0;
  std::
  unordered_multiset<long_long,_std::hash<long_long>,_std::equal_to<long_long>,_std::allocator<long_long>_>
  ::unordered_multiset(&local_9b8);
  jessilib::object::
  get<std::unordered_multiset<long_long,_std::hash<long_long>,_std::equal_to<long_long>,_std::allocator<long_long>_>,_std::unordered_multiset<long_long,_std::hash<long_long>,_std::equal_to<long_long>,_std::allocator<long_long>_>,_nullptr>
            (&local_978,(object *)local_58,&local_9b8);
  local_9f8._M_h._M_rehash_policy._M_max_load_factor = 0.0;
  local_9f8._M_h._M_rehash_policy._4_4_ = 0;
  local_9f8._M_h._M_rehash_policy._M_next_resize = 0;
  local_9f8._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
  local_9f8._M_h._M_element_count = 0;
  local_9f8._M_h._M_buckets = (__buckets_ptr)0x0;
  local_9f8._M_h._M_bucket_count = 0;
  local_9f8._M_h._M_single_bucket = (__node_base_ptr)0x0;
  std::
  unordered_multiset<long_long,_std::hash<long_long>,_std::equal_to<long_long>,_std::allocator<long_long>_>
  ::unordered_multiset(&local_9f8);
  testing::internal::EqHelper::
  Compare<std::unordered_multiset<long_long,_std::hash<long_long>,_std::equal_to<long_long>,_std::allocator<long_long>_>,_std::unordered_multiset<long_long,_std::hash<long_long>,_std::equal_to<long_long>,_std::allocator<long_long>_>,_nullptr>
            ((EqHelper *)local_940,"obj .get< std::unordered_multiset<long long> >()",
             "std::unordered_multiset<long long> {}",&local_978,&local_9f8);
  std::
  unordered_multiset<long_long,_std::hash<long_long>,_std::equal_to<long_long>,_std::allocator<long_long>_>
  ::~unordered_multiset(&local_9f8);
  std::
  unordered_multiset<long_long,_std::hash<long_long>,_std::equal_to<long_long>,_std::allocator<long_long>_>
  ::~unordered_multiset(&local_978);
  std::
  unordered_multiset<long_long,_std::hash<long_long>,_std::equal_to<long_long>,_std::allocator<long_long>_>
  ::~unordered_multiset(&local_9b8);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_940);
  if (!bVar1) {
    testing::Message::Message(local_a00);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_940);
    testing::internal::AssertHelper::AssertHelper
              (local_a08,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/JAJames[P]Jupiter-Bot/src/Jupiter/src/jessilib/src/test/object.cpp"
               ,0x31d,pcVar2);
    testing::internal::AssertHelper::operator=(local_a08,local_a00);
    testing::internal::AssertHelper::~AssertHelper(local_a08);
    testing::Message::~Message(local_a00);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_940);
  gtest_ar__7.message_._M_t.
  super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_t.
  super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  .
  super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  ._M_head_impl =
       (__uniq_ptr_data<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
        )(__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          )0x0;
  std::unordered_multiset<long,_std::hash<long>,_std::equal_to<long>,_std::allocator<long>_>::
  unordered_multiset((unordered_multiset<long,_std::hash<long>,_std::equal_to<long>,_std::allocator<long>_>
                      *)&gtest_ar__7.message_);
  jessilib::object::
  operator=<std::unordered_multiset<long,_std::hash<long>,_std::equal_to<long>,_std::allocator<long>_>,_nullptr>
            ((object *)local_58,
             (unordered_multiset<long,_std::hash<long>,_std::equal_to<long>,_std::allocator<long>_>
              *)&gtest_ar__7.message_);
  std::unordered_multiset<long,_std::hash<long>,_std::equal_to<long>,_std::allocator<long>_>::
  ~unordered_multiset((unordered_multiset<long,_std::hash<long>,_std::equal_to<long>,_std::allocator<long>_>
                       *)&gtest_ar__7.message_);
  local_a59 = jessilib::object::
              has<std::unordered_multiset<long,std::hash<long>,std::equal_to<long>,std::allocator<long>>>
                        ((object *)local_58);
  testing::AssertionResult::AssertionResult<bool>
            ((AssertionResult *)local_a58,&local_a59,(type *)0x0);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_a58);
  if (!bVar1) {
    testing::Message::Message(local_a68);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((AssertionResult *)&gtest_ar_7.message_,local_a58,
               "obj .has< std::unordered_multiset<intmax_t> >()","false");
    pcVar2 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::c_str
                       ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                        &gtest_ar_7.message_);
    testing::internal::AssertHelper::AssertHelper
              (local_a70,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/JAJames[P]Jupiter-Bot/src/Jupiter/src/jessilib/src/test/object.cpp"
               ,0x31e,pcVar2);
    testing::internal::AssertHelper::operator=(local_a70,local_a68);
    testing::internal::AssertHelper::~AssertHelper(local_a70);
    std::__cxx11::string::~string((string *)&gtest_ar_7.message_);
    testing::Message::~Message(local_a68);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_a58);
  local_b18._M_h._M_rehash_policy._M_max_load_factor = 0.0;
  local_b18._M_h._M_rehash_policy._4_4_ = 0;
  local_b18._M_h._M_rehash_policy._M_next_resize = 0;
  local_b18._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
  local_b18._M_h._M_element_count = 0;
  local_b18._M_h._M_buckets = (__buckets_ptr)0x0;
  local_b18._M_h._M_bucket_count = 0;
  local_b18._M_h._M_single_bucket = (__node_base_ptr)0x0;
  std::unordered_multiset<long,_std::hash<long>,_std::equal_to<long>,_std::allocator<long>_>::
  unordered_multiset(&local_b18);
  jessilib::object::
  get<std::unordered_multiset<long,_std::hash<long>,_std::equal_to<long>,_std::allocator<long>_>,_std::unordered_multiset<long,_std::hash<long>,_std::equal_to<long>,_std::allocator<long>_>,_nullptr>
            (&local_ad8,(object *)local_58,&local_b18);
  local_b58._M_h._M_rehash_policy._M_max_load_factor = 0.0;
  local_b58._M_h._M_rehash_policy._4_4_ = 0;
  local_b58._M_h._M_rehash_policy._M_next_resize = 0;
  local_b58._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
  local_b58._M_h._M_element_count = 0;
  local_b58._M_h._M_buckets = (__buckets_ptr)0x0;
  local_b58._M_h._M_bucket_count = 0;
  local_b58._M_h._M_single_bucket = (__node_base_ptr)0x0;
  std::unordered_multiset<long,_std::hash<long>,_std::equal_to<long>,_std::allocator<long>_>::
  unordered_multiset(&local_b58);
  testing::internal::EqHelper::
  Compare<std::unordered_multiset<long,_std::hash<long>,_std::equal_to<long>,_std::allocator<long>_>,_std::unordered_multiset<long,_std::hash<long>,_std::equal_to<long>,_std::allocator<long>_>,_nullptr>
            ((EqHelper *)local_aa0,"obj .get< std::unordered_multiset<intmax_t> >()",
             "std::unordered_multiset<intmax_t> {}",&local_ad8,&local_b58);
  std::unordered_multiset<long,_std::hash<long>,_std::equal_to<long>,_std::allocator<long>_>::
  ~unordered_multiset(&local_b58);
  std::unordered_multiset<long,_std::hash<long>,_std::equal_to<long>,_std::allocator<long>_>::
  ~unordered_multiset(&local_ad8);
  std::unordered_multiset<long,_std::hash<long>,_std::equal_to<long>,_std::allocator<long>_>::
  ~unordered_multiset(&local_b18);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_aa0);
  if (!bVar1) {
    testing::Message::Message(local_b60);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_aa0);
    testing::internal::AssertHelper::AssertHelper
              (local_b68,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/JAJames[P]Jupiter-Bot/src/Jupiter/src/jessilib/src/test/object.cpp"
               ,0x31e,pcVar2);
    testing::internal::AssertHelper::operator=(local_b68,local_b60);
    testing::internal::AssertHelper::~AssertHelper(local_b68);
    testing::Message::~Message(local_b60);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_aa0);
  gtest_ar__8.message_._M_t.
  super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_t.
  super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  .
  super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  ._M_head_impl =
       (__uniq_ptr_data<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
        )(__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          )0x0;
  std::unordered_multiset<float,_std::hash<float>,_std::equal_to<float>,_std::allocator<float>_>::
  unordered_multiset((unordered_multiset<float,_std::hash<float>,_std::equal_to<float>,_std::allocator<float>_>
                      *)&gtest_ar__8.message_);
  jessilib::object::
  operator=<std::unordered_multiset<float,_std::hash<float>,_std::equal_to<float>,_std::allocator<float>_>,_nullptr>
            ((object *)local_58,
             (unordered_multiset<float,_std::hash<float>,_std::equal_to<float>,_std::allocator<float>_>
              *)&gtest_ar__8.message_);
  std::unordered_multiset<float,_std::hash<float>,_std::equal_to<float>,_std::allocator<float>_>::
  ~unordered_multiset((unordered_multiset<float,_std::hash<float>,_std::equal_to<float>,_std::allocator<float>_>
                       *)&gtest_ar__8.message_);
  local_bb9 = jessilib::object::
              has<std::unordered_multiset<float,std::hash<float>,std::equal_to<float>,std::allocator<float>>>
                        ((object *)local_58);
  testing::AssertionResult::AssertionResult<bool>
            ((AssertionResult *)local_bb8,&local_bb9,(type *)0x0);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_bb8);
  if (!bVar1) {
    testing::Message::Message(local_bc8);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((AssertionResult *)&gtest_ar_8.message_,local_bb8,
               "obj .has< std::unordered_multiset<float> >()","false");
    pcVar2 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::c_str
                       ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                        &gtest_ar_8.message_);
    testing::internal::AssertHelper::AssertHelper
              (local_bd0,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/JAJames[P]Jupiter-Bot/src/Jupiter/src/jessilib/src/test/object.cpp"
               ,799,pcVar2);
    testing::internal::AssertHelper::operator=(local_bd0,local_bc8);
    testing::internal::AssertHelper::~AssertHelper(local_bd0);
    std::__cxx11::string::~string((string *)&gtest_ar_8.message_);
    testing::Message::~Message(local_bc8);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_bb8);
  local_c78._M_h._M_rehash_policy._M_max_load_factor = 0.0;
  local_c78._M_h._M_rehash_policy._4_4_ = 0;
  local_c78._M_h._M_rehash_policy._M_next_resize = 0;
  local_c78._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
  local_c78._M_h._M_element_count = 0;
  local_c78._M_h._M_buckets = (__buckets_ptr)0x0;
  local_c78._M_h._M_bucket_count = 0;
  local_c78._M_h._M_single_bucket = (__node_base_ptr)0x0;
  std::unordered_multiset<float,_std::hash<float>,_std::equal_to<float>,_std::allocator<float>_>::
  unordered_multiset(&local_c78);
  jessilib::object::
  get<std::unordered_multiset<float,_std::hash<float>,_std::equal_to<float>,_std::allocator<float>_>,_std::unordered_multiset<float,_std::hash<float>,_std::equal_to<float>,_std::allocator<float>_>,_nullptr>
            (&local_c38,(object *)local_58,&local_c78);
  local_cb8._M_h._M_rehash_policy._M_max_load_factor = 0.0;
  local_cb8._M_h._M_rehash_policy._4_4_ = 0;
  local_cb8._M_h._M_rehash_policy._M_next_resize = 0;
  local_cb8._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
  local_cb8._M_h._M_element_count = 0;
  local_cb8._M_h._M_buckets = (__buckets_ptr)0x0;
  local_cb8._M_h._M_bucket_count = 0;
  local_cb8._M_h._M_single_bucket = (__node_base_ptr)0x0;
  std::unordered_multiset<float,_std::hash<float>,_std::equal_to<float>,_std::allocator<float>_>::
  unordered_multiset(&local_cb8);
  testing::internal::EqHelper::
  Compare<std::unordered_multiset<float,_std::hash<float>,_std::equal_to<float>,_std::allocator<float>_>,_std::unordered_multiset<float,_std::hash<float>,_std::equal_to<float>,_std::allocator<float>_>,_nullptr>
            ((EqHelper *)local_c00,"obj .get< std::unordered_multiset<float> >()",
             "std::unordered_multiset<float> {}",&local_c38,&local_cb8);
  std::unordered_multiset<float,_std::hash<float>,_std::equal_to<float>,_std::allocator<float>_>::
  ~unordered_multiset(&local_cb8);
  std::unordered_multiset<float,_std::hash<float>,_std::equal_to<float>,_std::allocator<float>_>::
  ~unordered_multiset(&local_c38);
  std::unordered_multiset<float,_std::hash<float>,_std::equal_to<float>,_std::allocator<float>_>::
  ~unordered_multiset(&local_c78);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_c00);
  if (!bVar1) {
    testing::Message::Message(local_cc0);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_c00);
    testing::internal::AssertHelper::AssertHelper
              (local_cc8,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/JAJames[P]Jupiter-Bot/src/Jupiter/src/jessilib/src/test/object.cpp"
               ,799,pcVar2);
    testing::internal::AssertHelper::operator=(local_cc8,local_cc0);
    testing::internal::AssertHelper::~AssertHelper(local_cc8);
    testing::Message::~Message(local_cc0);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_c00);
  gtest_ar__9.message_._M_t.
  super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_t.
  super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  .
  super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  ._M_head_impl =
       (__uniq_ptr_data<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
        )(__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          )0x0;
  std::unordered_multiset<double,_std::hash<double>,_std::equal_to<double>,_std::allocator<double>_>
  ::unordered_multiset
            ((unordered_multiset<double,_std::hash<double>,_std::equal_to<double>,_std::allocator<double>_>
              *)&gtest_ar__9.message_);
  jessilib::object::
  operator=<std::unordered_multiset<double,_std::hash<double>,_std::equal_to<double>,_std::allocator<double>_>,_nullptr>
            ((object *)local_58,
             (unordered_multiset<double,_std::hash<double>,_std::equal_to<double>,_std::allocator<double>_>
              *)&gtest_ar__9.message_);
  std::unordered_multiset<double,_std::hash<double>,_std::equal_to<double>,_std::allocator<double>_>
  ::~unordered_multiset
            ((unordered_multiset<double,_std::hash<double>,_std::equal_to<double>,_std::allocator<double>_>
              *)&gtest_ar__9.message_);
  local_d19 = jessilib::object::
              has<std::unordered_multiset<double,std::hash<double>,std::equal_to<double>,std::allocator<double>>>
                        ((object *)local_58);
  testing::AssertionResult::AssertionResult<bool>
            ((AssertionResult *)local_d18,&local_d19,(type *)0x0);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_d18);
  if (!bVar1) {
    testing::Message::Message(local_d28);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((AssertionResult *)&gtest_ar_9.message_,local_d18,
               "obj .has< std::unordered_multiset<double> >()","false");
    pcVar2 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::c_str
                       ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                        &gtest_ar_9.message_);
    testing::internal::AssertHelper::AssertHelper
              (local_d30,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/JAJames[P]Jupiter-Bot/src/Jupiter/src/jessilib/src/test/object.cpp"
               ,800,pcVar2);
    testing::internal::AssertHelper::operator=(local_d30,local_d28);
    testing::internal::AssertHelper::~AssertHelper(local_d30);
    std::__cxx11::string::~string((string *)&gtest_ar_9.message_);
    testing::Message::~Message(local_d28);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_d18);
  local_dd8._M_h._M_rehash_policy._M_max_load_factor = 0.0;
  local_dd8._M_h._M_rehash_policy._4_4_ = 0;
  local_dd8._M_h._M_rehash_policy._M_next_resize = 0;
  local_dd8._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
  local_dd8._M_h._M_element_count = 0;
  local_dd8._M_h._M_buckets = (__buckets_ptr)0x0;
  local_dd8._M_h._M_bucket_count = 0;
  local_dd8._M_h._M_single_bucket = (__node_base_ptr)0x0;
  std::unordered_multiset<double,_std::hash<double>,_std::equal_to<double>,_std::allocator<double>_>
  ::unordered_multiset(&local_dd8);
  jessilib::object::
  get<std::unordered_multiset<double,_std::hash<double>,_std::equal_to<double>,_std::allocator<double>_>,_std::unordered_multiset<double,_std::hash<double>,_std::equal_to<double>,_std::allocator<double>_>,_nullptr>
            (&local_d98,(object *)local_58,&local_dd8);
  local_e18._M_h._M_rehash_policy._M_max_load_factor = 0.0;
  local_e18._M_h._M_rehash_policy._4_4_ = 0;
  local_e18._M_h._M_rehash_policy._M_next_resize = 0;
  local_e18._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
  local_e18._M_h._M_element_count = 0;
  local_e18._M_h._M_buckets = (__buckets_ptr)0x0;
  local_e18._M_h._M_bucket_count = 0;
  local_e18._M_h._M_single_bucket = (__node_base_ptr)0x0;
  std::unordered_multiset<double,_std::hash<double>,_std::equal_to<double>,_std::allocator<double>_>
  ::unordered_multiset(&local_e18);
  testing::internal::EqHelper::
  Compare<std::unordered_multiset<double,_std::hash<double>,_std::equal_to<double>,_std::allocator<double>_>,_std::unordered_multiset<double,_std::hash<double>,_std::equal_to<double>,_std::allocator<double>_>,_nullptr>
            ((EqHelper *)local_d60,"obj .get< std::unordered_multiset<double> >()",
             "std::unordered_multiset<double> {}",&local_d98,&local_e18);
  std::unordered_multiset<double,_std::hash<double>,_std::equal_to<double>,_std::allocator<double>_>
  ::~unordered_multiset(&local_e18);
  std::unordered_multiset<double,_std::hash<double>,_std::equal_to<double>,_std::allocator<double>_>
  ::~unordered_multiset(&local_d98);
  std::unordered_multiset<double,_std::hash<double>,_std::equal_to<double>,_std::allocator<double>_>
  ::~unordered_multiset(&local_dd8);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_d60);
  if (!bVar1) {
    testing::Message::Message(local_e20);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_d60);
    testing::internal::AssertHelper::AssertHelper
              (local_e28,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/JAJames[P]Jupiter-Bot/src/Jupiter/src/jessilib/src/test/object.cpp"
               ,800,pcVar2);
    testing::internal::AssertHelper::operator=(local_e28,local_e20);
    testing::internal::AssertHelper::~AssertHelper(local_e28);
    testing::Message::~Message(local_e20);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_d60);
  gtest_ar__10.message_._M_t.
  super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_t.
  super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  .
  super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  ._M_head_impl =
       (__uniq_ptr_data<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
        )(__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          )0x0;
  std::
  unordered_multiset<long_double,_std::hash<long_double>,_std::equal_to<long_double>,_std::allocator<long_double>_>
  ::unordered_multiset
            ((unordered_multiset<long_double,_std::hash<long_double>,_std::equal_to<long_double>,_std::allocator<long_double>_>
              *)&gtest_ar__10.message_);
  jessilib::object::
  operator=<std::unordered_multiset<long_double,_std::hash<long_double>,_std::equal_to<long_double>,_std::allocator<long_double>_>,_nullptr>
            ((object *)local_58,
             (unordered_multiset<long_double,_std::hash<long_double>,_std::equal_to<long_double>,_std::allocator<long_double>_>
              *)&gtest_ar__10.message_);
  std::
  unordered_multiset<long_double,_std::hash<long_double>,_std::equal_to<long_double>,_std::allocator<long_double>_>
  ::~unordered_multiset
            ((unordered_multiset<long_double,_std::hash<long_double>,_std::equal_to<long_double>,_std::allocator<long_double>_>
              *)&gtest_ar__10.message_);
  local_e79 = jessilib::object::
              has<std::unordered_multiset<long_double,std::hash<long_double>,std::equal_to<long_double>,std::allocator<long_double>>>
                        ((object *)local_58);
  testing::AssertionResult::AssertionResult<bool>
            ((AssertionResult *)local_e78,&local_e79,(type *)0x0);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_e78);
  if (!bVar1) {
    testing::Message::Message(local_e88);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((AssertionResult *)&gtest_ar_10.message_,local_e78,
               "obj .has< std::unordered_multiset<long double> >()","false");
    pcVar2 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::c_str
                       ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                        &gtest_ar_10.message_);
    testing::internal::AssertHelper::AssertHelper
              (local_e90,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/JAJames[P]Jupiter-Bot/src/Jupiter/src/jessilib/src/test/object.cpp"
               ,0x321,pcVar2);
    testing::internal::AssertHelper::operator=(local_e90,local_e88);
    testing::internal::AssertHelper::~AssertHelper(local_e90);
    std::__cxx11::string::~string((string *)&gtest_ar_10.message_);
    testing::Message::~Message(local_e88);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_e78);
  local_f38._M_h._M_rehash_policy._M_max_load_factor = 0.0;
  local_f38._M_h._M_rehash_policy._4_4_ = 0;
  local_f38._M_h._M_rehash_policy._M_next_resize = 0;
  local_f38._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
  local_f38._M_h._M_element_count = 0;
  local_f38._M_h._M_buckets = (__buckets_ptr)0x0;
  local_f38._M_h._M_bucket_count = 0;
  local_f38._M_h._M_single_bucket = (__node_base_ptr)0x0;
  std::
  unordered_multiset<long_double,_std::hash<long_double>,_std::equal_to<long_double>,_std::allocator<long_double>_>
  ::unordered_multiset(&local_f38);
  jessilib::object::
  get<std::unordered_multiset<long_double,_std::hash<long_double>,_std::equal_to<long_double>,_std::allocator<long_double>_>,_std::unordered_multiset<long_double,_std::hash<long_double>,_std::equal_to<long_double>,_std::allocator<long_double>_>,_nullptr>
            (&local_ef8,(object *)local_58,&local_f38);
  local_f78._M_h._M_rehash_policy._M_max_load_factor = 0.0;
  local_f78._M_h._M_rehash_policy._4_4_ = 0;
  local_f78._M_h._M_rehash_policy._M_next_resize = 0;
  local_f78._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
  local_f78._M_h._M_element_count = 0;
  local_f78._M_h._M_buckets = (__buckets_ptr)0x0;
  local_f78._M_h._M_bucket_count = 0;
  local_f78._M_h._M_single_bucket = (__node_base_ptr)0x0;
  std::
  unordered_multiset<long_double,_std::hash<long_double>,_std::equal_to<long_double>,_std::allocator<long_double>_>
  ::unordered_multiset(&local_f78);
  testing::internal::EqHelper::
  Compare<std::unordered_multiset<long_double,_std::hash<long_double>,_std::equal_to<long_double>,_std::allocator<long_double>_>,_std::unordered_multiset<long_double,_std::hash<long_double>,_std::equal_to<long_double>,_std::allocator<long_double>_>,_nullptr>
            ((EqHelper *)local_ec0,"obj .get< std::unordered_multiset<long double> >()",
             "std::unordered_multiset<long double> {}",&local_ef8,&local_f78);
  std::
  unordered_multiset<long_double,_std::hash<long_double>,_std::equal_to<long_double>,_std::allocator<long_double>_>
  ::~unordered_multiset(&local_f78);
  std::
  unordered_multiset<long_double,_std::hash<long_double>,_std::equal_to<long_double>,_std::allocator<long_double>_>
  ::~unordered_multiset(&local_ef8);
  std::
  unordered_multiset<long_double,_std::hash<long_double>,_std::equal_to<long_double>,_std::allocator<long_double>_>
  ::~unordered_multiset(&local_f38);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_ec0);
  if (!bVar1) {
    testing::Message::Message(local_f80);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_ec0);
    testing::internal::AssertHelper::AssertHelper
              (local_f88,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/JAJames[P]Jupiter-Bot/src/Jupiter/src/jessilib/src/test/object.cpp"
               ,0x321,pcVar2);
    testing::internal::AssertHelper::operator=(local_f88,local_f80);
    testing::internal::AssertHelper::~AssertHelper(local_f88);
    testing::Message::~Message(local_f80);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_ec0);
  gtest_ar__11.message_._M_t.
  super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_t.
  super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  .
  super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  ._M_head_impl =
       (__uniq_ptr_data<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
        )(__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          )0x0;
  std::
  unordered_multiset<std::__cxx11::basic_string<char8_t,_std::char_traits<char8_t>,_std::allocator<char8_t>_>,_std::hash<std::__cxx11::basic_string<char8_t,_std::char_traits<char8_t>,_std::allocator<char8_t>_>_>,_std::equal_to<std::__cxx11::basic_string<char8_t,_std::char_traits<char8_t>,_std::allocator<char8_t>_>_>,_std::allocator<std::__cxx11::basic_string<char8_t,_std::char_traits<char8_t>,_std::allocator<char8_t>_>_>_>
  ::unordered_multiset
            ((unordered_multiset<std::__cxx11::basic_string<char8_t,_std::char_traits<char8_t>,_std::allocator<char8_t>_>,_std::hash<std::__cxx11::basic_string<char8_t,_std::char_traits<char8_t>,_std::allocator<char8_t>_>_>,_std::equal_to<std::__cxx11::basic_string<char8_t,_std::char_traits<char8_t>,_std::allocator<char8_t>_>_>,_std::allocator<std::__cxx11::basic_string<char8_t,_std::char_traits<char8_t>,_std::allocator<char8_t>_>_>_>
              *)&gtest_ar__11.message_);
  jessilib::object::
  operator=<std::unordered_multiset<std::__cxx11::basic_string<char8_t,_std::char_traits<char8_t>,_std::allocator<char8_t>_>,_std::hash<std::__cxx11::basic_string<char8_t,_std::char_traits<char8_t>,_std::allocator<char8_t>_>_>,_std::equal_to<std::__cxx11::basic_string<char8_t,_std::char_traits<char8_t>,_std::allocator<char8_t>_>_>,_std::allocator<std::__cxx11::basic_string<char8_t,_std::char_traits<char8_t>,_std::allocator<char8_t>_>_>_>,_nullptr>
            ((object *)local_58,
             (unordered_multiset<std::__cxx11::basic_string<char8_t,_std::char_traits<char8_t>,_std::allocator<char8_t>_>,_std::hash<std::__cxx11::basic_string<char8_t,_std::char_traits<char8_t>,_std::allocator<char8_t>_>_>,_std::equal_to<std::__cxx11::basic_string<char8_t,_std::char_traits<char8_t>,_std::allocator<char8_t>_>_>,_std::allocator<std::__cxx11::basic_string<char8_t,_std::char_traits<char8_t>,_std::allocator<char8_t>_>_>_>
              *)&gtest_ar__11.message_);
  std::
  unordered_multiset<std::__cxx11::basic_string<char8_t,_std::char_traits<char8_t>,_std::allocator<char8_t>_>,_std::hash<std::__cxx11::basic_string<char8_t,_std::char_traits<char8_t>,_std::allocator<char8_t>_>_>,_std::equal_to<std::__cxx11::basic_string<char8_t,_std::char_traits<char8_t>,_std::allocator<char8_t>_>_>,_std::allocator<std::__cxx11::basic_string<char8_t,_std::char_traits<char8_t>,_std::allocator<char8_t>_>_>_>
  ::~unordered_multiset
            ((unordered_multiset<std::__cxx11::basic_string<char8_t,_std::char_traits<char8_t>,_std::allocator<char8_t>_>,_std::hash<std::__cxx11::basic_string<char8_t,_std::char_traits<char8_t>,_std::allocator<char8_t>_>_>,_std::equal_to<std::__cxx11::basic_string<char8_t,_std::char_traits<char8_t>,_std::allocator<char8_t>_>_>,_std::allocator<std::__cxx11::basic_string<char8_t,_std::char_traits<char8_t>,_std::allocator<char8_t>_>_>_>
              *)&gtest_ar__11.message_);
  local_fd9 = jessilib::object::
              has<std::unordered_multiset<std::__cxx11::u8string,std::hash<std::__cxx11::u8string>,std::equal_to<std::__cxx11::u8string>,std::allocator<std::__cxx11::u8string>>>
                        ((object *)local_58);
  testing::AssertionResult::AssertionResult<bool>
            ((AssertionResult *)local_fd8,&local_fd9,(type *)0x0);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_fd8);
  if (!bVar1) {
    testing::Message::Message(local_fe8);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((AssertionResult *)&gtest_ar_11.message_,local_fd8,
               "obj .has< std::unordered_multiset<std::u8string> >()","false");
    pcVar2 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::c_str
                       ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                        &gtest_ar_11.message_);
    testing::internal::AssertHelper::AssertHelper
              (local_ff0,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/JAJames[P]Jupiter-Bot/src/Jupiter/src/jessilib/src/test/object.cpp"
               ,0x322,pcVar2);
    testing::internal::AssertHelper::operator=(local_ff0,local_fe8);
    testing::internal::AssertHelper::~AssertHelper(local_ff0);
    std::__cxx11::string::~string((string *)&gtest_ar_11.message_);
    testing::Message::~Message(local_fe8);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_fd8);
  local_1098._M_h._M_rehash_policy._M_max_load_factor = 0.0;
  local_1098._M_h._M_rehash_policy._4_4_ = 0;
  local_1098._M_h._M_rehash_policy._M_next_resize = 0;
  local_1098._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
  local_1098._M_h._M_element_count = 0;
  local_1098._M_h._M_buckets = (__buckets_ptr)0x0;
  local_1098._M_h._M_bucket_count = 0;
  local_1098._M_h._M_single_bucket = (__node_base_ptr)0x0;
  std::
  unordered_multiset<std::__cxx11::basic_string<char8_t,_std::char_traits<char8_t>,_std::allocator<char8_t>_>,_std::hash<std::__cxx11::basic_string<char8_t,_std::char_traits<char8_t>,_std::allocator<char8_t>_>_>,_std::equal_to<std::__cxx11::basic_string<char8_t,_std::char_traits<char8_t>,_std::allocator<char8_t>_>_>,_std::allocator<std::__cxx11::basic_string<char8_t,_std::char_traits<char8_t>,_std::allocator<char8_t>_>_>_>
  ::unordered_multiset(&local_1098);
  jessilib::object::
  get<std::unordered_multiset<std::__cxx11::basic_string<char8_t,_std::char_traits<char8_t>,_std::allocator<char8_t>_>,_std::hash<std::__cxx11::basic_string<char8_t,_std::char_traits<char8_t>,_std::allocator<char8_t>_>_>,_std::equal_to<std::__cxx11::basic_string<char8_t,_std::char_traits<char8_t>,_std::allocator<char8_t>_>_>,_std::allocator<std::__cxx11::basic_string<char8_t,_std::char_traits<char8_t>,_std::allocator<char8_t>_>_>_>,_std::unordered_multiset<std::__cxx11::basic_string<char8_t,_std::char_traits<char8_t>,_std::allocator<char8_t>_>,_std::hash<std::__cxx11::basic_string<char8_t,_std::char_traits<char8_t>,_std::allocator<char8_t>_>_>,_std::equal_to<std::__cxx11::basic_string<char8_t,_std::char_traits<char8_t>,_std::allocator<char8_t>_>_>,_std::allocator<std::__cxx11::basic_string<char8_t,_std::char_traits<char8_t>,_std::allocator<char8_t>_>_>_>,_nullptr>
            (&local_1058,(object *)local_58,&local_1098);
  local_10d8._M_h._M_rehash_policy._M_max_load_factor = 0.0;
  local_10d8._M_h._M_rehash_policy._4_4_ = 0;
  local_10d8._M_h._M_rehash_policy._M_next_resize = 0;
  local_10d8._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
  local_10d8._M_h._M_element_count = 0;
  local_10d8._M_h._M_buckets = (__buckets_ptr)0x0;
  local_10d8._M_h._M_bucket_count = 0;
  local_10d8._M_h._M_single_bucket = (__node_base_ptr)0x0;
  std::
  unordered_multiset<std::__cxx11::basic_string<char8_t,_std::char_traits<char8_t>,_std::allocator<char8_t>_>,_std::hash<std::__cxx11::basic_string<char8_t,_std::char_traits<char8_t>,_std::allocator<char8_t>_>_>,_std::equal_to<std::__cxx11::basic_string<char8_t,_std::char_traits<char8_t>,_std::allocator<char8_t>_>_>,_std::allocator<std::__cxx11::basic_string<char8_t,_std::char_traits<char8_t>,_std::allocator<char8_t>_>_>_>
  ::unordered_multiset(&local_10d8);
  testing::internal::EqHelper::
  Compare<std::unordered_multiset<std::__cxx11::basic_string<char8_t,_std::char_traits<char8_t>,_std::allocator<char8_t>_>,_std::hash<std::__cxx11::basic_string<char8_t,_std::char_traits<char8_t>,_std::allocator<char8_t>_>_>,_std::equal_to<std::__cxx11::basic_string<char8_t,_std::char_traits<char8_t>,_std::allocator<char8_t>_>_>,_std::allocator<std::__cxx11::basic_string<char8_t,_std::char_traits<char8_t>,_std::allocator<char8_t>_>_>_>,_std::unordered_multiset<std::__cxx11::basic_string<char8_t,_std::char_traits<char8_t>,_std::allocator<char8_t>_>,_std::hash<std::__cxx11::basic_string<char8_t,_std::char_traits<char8_t>,_std::allocator<char8_t>_>_>,_std::equal_to<std::__cxx11::basic_string<char8_t,_std::char_traits<char8_t>,_std::allocator<char8_t>_>_>,_std::allocator<std::__cxx11::basic_string<char8_t,_std::char_traits<char8_t>,_std::allocator<char8_t>_>_>_>,_nullptr>
            ((EqHelper *)local_1020,"obj .get< std::unordered_multiset<std::u8string> >()",
             "std::unordered_multiset<std::u8string> {}",&local_1058,&local_10d8);
  std::
  unordered_multiset<std::__cxx11::basic_string<char8_t,_std::char_traits<char8_t>,_std::allocator<char8_t>_>,_std::hash<std::__cxx11::basic_string<char8_t,_std::char_traits<char8_t>,_std::allocator<char8_t>_>_>,_std::equal_to<std::__cxx11::basic_string<char8_t,_std::char_traits<char8_t>,_std::allocator<char8_t>_>_>,_std::allocator<std::__cxx11::basic_string<char8_t,_std::char_traits<char8_t>,_std::allocator<char8_t>_>_>_>
  ::~unordered_multiset(&local_10d8);
  std::
  unordered_multiset<std::__cxx11::basic_string<char8_t,_std::char_traits<char8_t>,_std::allocator<char8_t>_>,_std::hash<std::__cxx11::basic_string<char8_t,_std::char_traits<char8_t>,_std::allocator<char8_t>_>_>,_std::equal_to<std::__cxx11::basic_string<char8_t,_std::char_traits<char8_t>,_std::allocator<char8_t>_>_>,_std::allocator<std::__cxx11::basic_string<char8_t,_std::char_traits<char8_t>,_std::allocator<char8_t>_>_>_>
  ::~unordered_multiset(&local_1058);
  std::
  unordered_multiset<std::__cxx11::basic_string<char8_t,_std::char_traits<char8_t>,_std::allocator<char8_t>_>,_std::hash<std::__cxx11::basic_string<char8_t,_std::char_traits<char8_t>,_std::allocator<char8_t>_>_>,_std::equal_to<std::__cxx11::basic_string<char8_t,_std::char_traits<char8_t>,_std::allocator<char8_t>_>_>,_std::allocator<std::__cxx11::basic_string<char8_t,_std::char_traits<char8_t>,_std::allocator<char8_t>_>_>_>
  ::~unordered_multiset(&local_1098);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_1020);
  if (!bVar1) {
    testing::Message::Message(local_10e0);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_1020);
    testing::internal::AssertHelper::AssertHelper
              (local_10e8,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/JAJames[P]Jupiter-Bot/src/Jupiter/src/jessilib/src/test/object.cpp"
               ,0x322,pcVar2);
    testing::internal::AssertHelper::operator=(local_10e8,local_10e0);
    testing::internal::AssertHelper::~AssertHelper(local_10e8);
    testing::Message::~Message(local_10e0);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_1020);
  gtest_ar__12.message_._M_t.
  super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_t.
  super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  .
  super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  ._M_head_impl =
       (__uniq_ptr_data<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
        )(__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          )0x0;
  std::
  unordered_set<jessilib::object,_std::hash<jessilib::object>,_std::equal_to<jessilib::object>,_std::allocator<jessilib::object>_>
  ::unordered_set((unordered_set<jessilib::object,_std::hash<jessilib::object>,_std::equal_to<jessilib::object>,_std::allocator<jessilib::object>_>
                   *)&gtest_ar__12.message_);
  jessilib::object::
  operator=<std::unordered_set<jessilib::object,_std::hash<jessilib::object>,_std::equal_to<jessilib::object>,_std::allocator<jessilib::object>_>,_nullptr>
            ((object *)local_58,
             (unordered_set<jessilib::object,_std::hash<jessilib::object>,_std::equal_to<jessilib::object>,_std::allocator<jessilib::object>_>
              *)&gtest_ar__12.message_);
  std::
  unordered_set<jessilib::object,_std::hash<jessilib::object>,_std::equal_to<jessilib::object>,_std::allocator<jessilib::object>_>
  ::~unordered_set((unordered_set<jessilib::object,_std::hash<jessilib::object>,_std::equal_to<jessilib::object>,_std::allocator<jessilib::object>_>
                    *)&gtest_ar__12.message_);
  local_1139 = jessilib::object::
               has<std::unordered_set<jessilib::object,std::hash<jessilib::object>,std::equal_to<jessilib::object>,std::allocator<jessilib::object>>>
                         ((object *)local_58);
  testing::AssertionResult::AssertionResult<bool>
            ((AssertionResult *)local_1138,&local_1139,(type *)0x0);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_1138);
  if (!bVar1) {
    testing::Message::Message(local_1148);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((AssertionResult *)&gtest_ar_12.message_,local_1138,
               "obj .has< std::unordered_set<object> >()","false");
    pcVar2 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::c_str
                       ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                        &gtest_ar_12.message_);
    testing::internal::AssertHelper::AssertHelper
              (local_1150,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/JAJames[P]Jupiter-Bot/src/Jupiter/src/jessilib/src/test/object.cpp"
               ,0x323,pcVar2);
    testing::internal::AssertHelper::operator=(local_1150,local_1148);
    testing::internal::AssertHelper::~AssertHelper(local_1150);
    std::__cxx11::string::~string((string *)&gtest_ar_12.message_);
    testing::Message::~Message(local_1148);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_1138);
  local_11f8._M_h._M_rehash_policy._M_max_load_factor = 0.0;
  local_11f8._M_h._M_rehash_policy._4_4_ = 0;
  local_11f8._M_h._M_rehash_policy._M_next_resize = 0;
  local_11f8._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
  local_11f8._M_h._M_element_count = 0;
  local_11f8._M_h._M_buckets = (__buckets_ptr)0x0;
  local_11f8._M_h._M_bucket_count = 0;
  local_11f8._M_h._M_single_bucket = (__node_base_ptr)0x0;
  std::
  unordered_set<jessilib::object,_std::hash<jessilib::object>,_std::equal_to<jessilib::object>,_std::allocator<jessilib::object>_>
  ::unordered_set(&local_11f8);
  jessilib::object::
  get<std::unordered_set<jessilib::object,_std::hash<jessilib::object>,_std::equal_to<jessilib::object>,_std::allocator<jessilib::object>_>,_std::unordered_set<jessilib::object,_std::hash<jessilib::object>,_std::equal_to<jessilib::object>,_std::allocator<jessilib::object>_>,_nullptr>
            (&local_11b8,(object *)local_58,&local_11f8);
  local_1238._M_h._M_rehash_policy._M_max_load_factor = 0.0;
  local_1238._M_h._M_rehash_policy._4_4_ = 0;
  local_1238._M_h._M_rehash_policy._M_next_resize = 0;
  local_1238._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
  local_1238._M_h._M_element_count = 0;
  local_1238._M_h._M_buckets = (__buckets_ptr)0x0;
  local_1238._M_h._M_bucket_count = 0;
  local_1238._M_h._M_single_bucket = (__node_base_ptr)0x0;
  std::
  unordered_set<jessilib::object,_std::hash<jessilib::object>,_std::equal_to<jessilib::object>,_std::allocator<jessilib::object>_>
  ::unordered_set(&local_1238);
  testing::internal::EqHelper::
  Compare<std::unordered_set<jessilib::object,_std::hash<jessilib::object>,_std::equal_to<jessilib::object>,_std::allocator<jessilib::object>_>,_std::unordered_set<jessilib::object,_std::hash<jessilib::object>,_std::equal_to<jessilib::object>,_std::allocator<jessilib::object>_>,_nullptr>
            ((EqHelper *)local_1180,"obj .get< std::unordered_set<object> >()",
             "std::unordered_set<object> {}",&local_11b8,&local_1238);
  std::
  unordered_set<jessilib::object,_std::hash<jessilib::object>,_std::equal_to<jessilib::object>,_std::allocator<jessilib::object>_>
  ::~unordered_set(&local_1238);
  std::
  unordered_set<jessilib::object,_std::hash<jessilib::object>,_std::equal_to<jessilib::object>,_std::allocator<jessilib::object>_>
  ::~unordered_set(&local_11b8);
  std::
  unordered_set<jessilib::object,_std::hash<jessilib::object>,_std::equal_to<jessilib::object>,_std::allocator<jessilib::object>_>
  ::~unordered_set(&local_11f8);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_1180);
  if (!bVar1) {
    testing::Message::Message(local_1240);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_1180);
    testing::internal::AssertHelper::AssertHelper
              (local_1248,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/JAJames[P]Jupiter-Bot/src/Jupiter/src/jessilib/src/test/object.cpp"
               ,0x323,pcVar2);
    testing::internal::AssertHelper::operator=(local_1248,local_1240);
    testing::internal::AssertHelper::~AssertHelper(local_1248);
    testing::Message::~Message(local_1240);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_1180);
  jessilib::object::~object((object *)local_58);
  return;
}

Assistant:

TEST(ObjectTest, basic_assignment_operator_unordered_multiset) {
	object obj;

	OBJECT_BASIC_ASSIGNMENT_OPERATOR_TEST(obj, std::unordered_multiset<bool>);
	OBJECT_BASIC_ASSIGNMENT_OPERATOR_TEST(obj, std::unordered_multiset<signed char>);
	OBJECT_BASIC_ASSIGNMENT_OPERATOR_TEST(obj, std::unordered_multiset<unsigned char>);
	OBJECT_BASIC_ASSIGNMENT_OPERATOR_TEST(obj, std::unordered_multiset<short>);
	OBJECT_BASIC_ASSIGNMENT_OPERATOR_TEST(obj, std::unordered_multiset<int>);
	OBJECT_BASIC_ASSIGNMENT_OPERATOR_TEST(obj, std::unordered_multiset<long>);
	OBJECT_BASIC_ASSIGNMENT_OPERATOR_TEST(obj, std::unordered_multiset<long long>);
	OBJECT_BASIC_ASSIGNMENT_OPERATOR_TEST(obj, std::unordered_multiset<intmax_t>);
	OBJECT_BASIC_ASSIGNMENT_OPERATOR_TEST(obj, std::unordered_multiset<float>);
	OBJECT_BASIC_ASSIGNMENT_OPERATOR_TEST(obj, std::unordered_multiset<double>);
	OBJECT_BASIC_ASSIGNMENT_OPERATOR_TEST(obj, std::unordered_multiset<long double>);
	OBJECT_BASIC_ASSIGNMENT_OPERATOR_TEST(obj, std::unordered_multiset<std::u8string>);
	OBJECT_BASIC_ASSIGNMENT_OPERATOR_TEST(obj, std::unordered_set<object>);
}